

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# file.cc
# Opt level: O1

Status __thiscall google::protobuf::File::RecursivelyCreateDir(File *this,string *path,int mode)

{
  _Alloc_hider _Var1;
  int iVar2;
  long lVar3;
  string_view message;
  string_view message_00;
  string local_40;
  
  CreateDir((File *)&local_40,path,mode);
  _Var1._M_p = local_40._M_dataplus._M_p;
  if (((ulong)local_40._M_dataplus._M_p & 1) == 0) {
    absl::lts_20250127::status_internal::StatusRep::Unref((StatusRep *)local_40._M_dataplus._M_p);
  }
  if ((StatusRep *)_Var1._M_p == (StatusRep *)0x1) {
    *(undefined8 *)this = 1;
  }
  else {
    iVar2 = access((path->_M_dataplus)._M_p,0);
    if (iVar2 == 0) {
      message._M_str = &DAT_00000013;
      message._M_len = (size_t)this;
      absl::lts_20250127::AlreadyExistsError(message);
    }
    else {
      lVar3 = std::__cxx11::string::rfind((char)path,0x2f);
      if (lVar3 == -1) {
        message_00._M_str = (char *)0xf;
        message_00._M_len = (size_t)this;
        absl::lts_20250127::FailedPreconditionError(message_00);
      }
      else {
        std::__cxx11::string::substr((ulong)&local_40,(ulong)path);
        RecursivelyCreateDir(this,&local_40,mode);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_40._M_dataplus._M_p != &local_40.field_2) {
          operator_delete(local_40._M_dataplus._M_p,local_40.field_2._M_allocated_capacity + 1);
        }
        if (*(long *)this == 1) {
          CreateDir(this,path,mode);
        }
      }
    }
  }
  return (Status)(uintptr_t)this;
}

Assistant:

absl::Status File::RecursivelyCreateDir(const std::string& path, int mode) {
  if (CreateDir(path, mode).ok()) return absl::OkStatus();

  if (Exists(path)) return absl::AlreadyExistsError("Path already exists");

  // Try creating the parent.
  std::string::size_type slashpos = path.find_last_of('/');
  if (slashpos == std::string::npos) {
    return absl::FailedPreconditionError("No parent given");
  }

  RETURN_IF_ERROR(RecursivelyCreateDir(path.substr(0, slashpos), mode));
  return CreateDir(path, mode);
}